

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qiconloader.cpp
# Opt level: O2

QIconLoaderEngineEntry * QIconLoaderEngine::entryForSize(QThemeIconInfo *info,QSize *size,int scale)

{
  Type TVar1;
  pointer puVar2;
  int iVar3;
  uint *puVar4;
  const_reference pvVar5;
  uint uVar6;
  QIconLoaderEngineEntry *pQVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  const_iterator __begin1;
  pointer puVar12;
  const_iterator __end1;
  int iVar13;
  int iVar14;
  long in_FS_OFFSET;
  QThemeIconEntries *__range1;
  QIconLoaderEngineEntry *local_50;
  _Optional_payload_base<int> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar12 = (info->entries).
            super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (info->entries).
           super__Vector_base<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar12 == puVar2) {
    pQVar7 = (QIconLoaderEngineEntry *)0x0;
  }
  else {
    if ((long)puVar2 - (long)puVar12 != 8) {
      iVar14 = (size->wd).m_i;
      iVar13 = (size->ht).m_i;
      if (iVar14 < iVar13) {
        iVar13 = iVar14;
      }
      iVar14 = iVar13 * scale;
      uVar10 = 0x80000000;
      local_50 = (QIconLoaderEngineEntry *)0x0;
      for (; puVar12 != puVar2; puVar12 = puVar12 + 1) {
        pQVar7 = (puVar12->_M_t).
                 super___uniq_ptr_impl<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QIconLoaderEngineEntry_*,_std::default_delete<QIconLoaderEngineEntry>_>
                 .super__Head_base<0UL,_QIconLoaderEngineEntry_*,_false>._M_head_impl;
        iVar3 = (int)(pQVar7->dir).scale;
        TVar1 = (pQVar7->dir).type;
        if (iVar3 == scale) {
          if (TVar1 == Fixed) {
            if (iVar13 != (pQVar7->dir).size) goto switchD_00262fb2_caseD_0;
          }
          else if (TVar1 == Threshold) {
            iVar8 = (int)(pQVar7->dir).size;
            iVar11 = (int)(pQVar7->dir).threshold;
            if (iVar13 < iVar8 - iVar11 || iVar11 + iVar8 < iVar13) goto switchD_00262fb2_caseD_2;
          }
          else {
            if (TVar1 != Scalable) goto code_r0x00262fa2;
            if (((pQVar7->dir).maxSize < iVar13) || (iVar13 < (pQVar7->dir).minSize)) {
switchD_00262fb2_caseD_1:
              iVar8 = (pQVar7->dir).minSize * iVar3;
              uVar9 = iVar8 - iVar14;
              if ((uVar9 != 0 && iVar14 <= iVar8) ||
                 (iVar3 = (pQVar7->dir).maxSize * iVar3, uVar9 = iVar14 - iVar3,
                 uVar9 != 0 && iVar3 <= iVar14)) goto LAB_00263058;
              goto switchD_00262fb2_caseD_3;
            }
          }
          goto LAB_002630c4;
        }
code_r0x00262fa2:
        switch(TVar1) {
        case Fixed:
switchD_00262fb2_caseD_0:
          uVar9 = iVar3 * (pQVar7->dir).size - iVar14;
          break;
        case Scalable:
          goto switchD_00262fb2_caseD_1;
        case Threshold:
switchD_00262fb2_caseD_2:
          iVar11 = (int)(pQVar7->dir).size;
          iVar8 = (int)(pQVar7->dir).threshold;
          if (iVar14 < (iVar11 - iVar8) * iVar3) {
            uVar9 = (pQVar7->dir).minSize * iVar3 - iVar14;
          }
          else {
            if (iVar14 <= (iVar8 + iVar11) * iVar3) goto switchD_00262fb2_caseD_3;
            uVar9 = iVar14 - (pQVar7->dir).maxSize * iVar3;
          }
          break;
        case Fallback:
          goto switchD_00262fb2_caseD_3;
        default:
          uVar9 = 0x7fffffff;
        }
LAB_00263058:
        local_40 = (_Optional_payload_base<int>)((ulong)uVar9 | 0x100000000);
        puVar4 = (uint *)std::optional<int>::value((optional<int> *)&local_40);
        uVar9 = *puVar4;
        if ((int)uVar10 < 1 && (int)uVar10 < (int)uVar9) {
LAB_00263093:
          local_50 = (puVar12->_M_t).
                     super___uniq_ptr_impl<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_QIconLoaderEngineEntry_*,_std::default_delete<QIconLoaderEngineEntry>_>
                     .super__Head_base<0UL,_QIconLoaderEngineEntry_*,_false>._M_head_impl;
          uVar10 = uVar9;
        }
        else if ((int)uVar9 < 1) {
          if (uVar9 == 0) {
            uVar9 = 0;
            goto LAB_00263093;
          }
        }
        else {
          uVar6 = -uVar10;
          if (0 < (int)uVar10) {
            uVar6 = uVar10;
          }
          if (uVar9 < uVar6) goto LAB_00263093;
        }
switchD_00262fb2_caseD_3:
      }
      pQVar7 = local_50;
      if (local_50 != (QIconLoaderEngineEntry *)0x0) goto LAB_002630c4;
    }
    pvVar5 = std::
             vector<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>,_std::allocator<std::unique_ptr<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>_>_>
             ::at(&info->entries,0);
    pQVar7 = (pvVar5->_M_t).
             super___uniq_ptr_impl<QIconLoaderEngineEntry,_std::default_delete<QIconLoaderEngineEntry>_>
             ._M_t.
             super__Tuple_impl<0UL,_QIconLoaderEngineEntry_*,_std::default_delete<QIconLoaderEngineEntry>_>
             .super__Head_base<0UL,_QIconLoaderEngineEntry_*,_false>._M_head_impl;
  }
LAB_002630c4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pQVar7;
}

Assistant:

QIconLoaderEngineEntry *QIconLoaderEngine::entryForSize(const QThemeIconInfo &info, const QSize &size, int scale)
{
    if (info.entries.empty())
        return nullptr;
    if (info.entries.size() == 1)
        return info.entries.at(0).get();

    int iconsize = qMin(size.width(), size.height());

    // Note that m_info.entries are sorted so that png-files
    // come first

    int minimalDelta = INT_MIN;
    QIconLoaderEngineEntry *closestMatch = nullptr;
    for (const auto &entry : info.entries) {
        // exact match in scale and dpr
        if (directoryMatchesSizeAndScale(entry->dir, iconsize, scale))
            return entry.get();

        // Find the minimum distance icon
        const auto delta = directorySizeDelta(entry->dir, iconsize, scale);
        if (delta.has_value()) {
            const auto deltaValue = delta.value();
            // always prefer downscaled icons over upscaled icons
            if (deltaValue > minimalDelta && minimalDelta <= 0) {
                minimalDelta = deltaValue;
                closestMatch = entry.get();
            } else if (deltaValue > 0 && deltaValue < qAbs(minimalDelta)) {
                minimalDelta = deltaValue;
                closestMatch = entry.get();
            } else if (deltaValue == 0) {
                // exact match but different dpr:
                // --> size * scale == entry.size * entry.scale
                minimalDelta = deltaValue;
                closestMatch = entry.get();
            }
        }
    }
    return closestMatch ? closestMatch : info.entries.at(0).get();
}